

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_enumerator.cpp
# Opt level: O2

void __thiscall duckdb::PlanEnumerator::InitLeafPlans(PlanEnumerator *this)

{
  templated_unique_single_t __p;
  idx_t iVar1;
  reference pvVar2;
  optional_ptr<duckdb::JoinRelationSet,_true> set;
  pointer pDVar3;
  __uniq_ptr_impl<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_> *this_00;
  ulong __n;
  templated_unique_single_t join_node;
  key_type local_b8;
  vector<duckdb::RelationStats,_true> relation_stats;
  value_type stats;
  
  RelationManager::GetRelationStats(&relation_stats,&this->query_graph_manager->relation_manager);
  CardinalityEstimator::InitEquivalentRelations
            (&this->cost_model->cardinality_estimator,
             &this->query_graph_manager->filters_and_bindings);
  for (__n = 0; __n < (ulong)(((long)relation_stats.
                                     super_vector<duckdb::RelationStats,_std::allocator<duckdb::RelationStats>_>
                                     .
                                     super__Vector_base<duckdb::RelationStats,_std::allocator<duckdb::RelationStats>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)relation_stats.
                                    super_vector<duckdb::RelationStats,_std::allocator<duckdb::RelationStats>_>
                                    .
                                    super__Vector_base<duckdb::RelationStats,_std::allocator<duckdb::RelationStats>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x68);
      __n = __n + 1) {
    pvVar2 = ::std::vector<duckdb::RelationStats,_std::allocator<duckdb::RelationStats>_>::at
                       (&relation_stats.
                         super_vector<duckdb::RelationStats,_std::allocator<duckdb::RelationStats>_>
                        ,__n);
    RelationStats::RelationStats(&stats,pvVar2);
    set.ptr = JoinRelationSetManager::GetJoinRelation(&this->query_graph_manager->set_manager,__n);
    make_uniq<duckdb::DPJoinNode,duckdb::JoinRelationSet&>((duckdb *)&join_node,set.ptr);
    pDVar3 = unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>::
             operator->(&join_node);
    iVar1 = stats.cardinality;
    pDVar3->cost = 0.0;
    pDVar3 = unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>::
             operator->(&join_node);
    pDVar3->cardinality = iVar1;
    local_b8._M_data = set.ptr;
    this_00 = (__uniq_ptr_impl<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_> *)
              ::std::__detail::
              _Map_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->plans,&local_b8);
    __p = join_node;
    join_node.super_unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_>._M_t.
    super___uniq_ptr_impl<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::DPJoinNode_*,_std::default_delete<duckdb::DPJoinNode>_>.
    super__Head_base<0UL,_duckdb::DPJoinNode_*,_false>._M_head_impl =
         (unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_>)
         (__uniq_ptr_data<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true,_true>)
         0x0;
    ::std::__uniq_ptr_impl<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_>::reset
              (this_00,(pointer)__p.
                                super_unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::DPJoinNode_*,_std::default_delete<duckdb::DPJoinNode>_>
                                .super__Head_base<0UL,_duckdb::DPJoinNode_*,_false>._M_head_impl);
    CardinalityEstimator::InitCardinalityEstimatorProps
              (&this->cost_model->cardinality_estimator,set,&stats);
    ::std::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_>::~unique_ptr
              (&join_node.
                super_unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_>);
    RelationStats::~RelationStats(&stats);
  }
  ::std::vector<duckdb::RelationStats,_std::allocator<duckdb::RelationStats>_>::~vector
            (&relation_stats.
              super_vector<duckdb::RelationStats,_std::allocator<duckdb::RelationStats>_>);
  return;
}

Assistant:

void PlanEnumerator::InitLeafPlans() {
	// First we initialize each of the single-node plans with themselves and with their cardinalities these are the leaf
	// nodes of the join tree NOTE: we can just use pointers to JoinRelationSet* here because the GetJoinRelation
	// function ensures that a unique combination of relations will have a unique JoinRelationSet object.
	// first initialize equivalent relations based on the filters
	auto relation_stats = query_graph_manager.relation_manager.GetRelationStats();

	cost_model.cardinality_estimator.InitEquivalentRelations(query_graph_manager.GetFilterBindings());
	cost_model.cardinality_estimator.AddRelationNamesToTdoms(relation_stats);

	// then update the total domains based on the cardinalities of each relation.
	for (idx_t i = 0; i < relation_stats.size(); i++) {
		auto stats = relation_stats.at(i);
		auto &relation_set = query_graph_manager.set_manager.GetJoinRelation(i);
		auto join_node = make_uniq<DPJoinNode>(relation_set);
		join_node->cost = 0;
		join_node->cardinality = stats.cardinality;
		D_ASSERT(join_node->set.count == 1);
		plans[relation_set] = std::move(join_node);
		cost_model.cardinality_estimator.InitCardinalityEstimatorProps(&relation_set, stats);
	}
}